

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

string * __thiscall
minja::TemplateToken::typeToString_abi_cxx11_
          (string *__return_storage_ptr__,TemplateToken *this,Type t)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "text";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "expression";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "if";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "else";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "elif";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "endif";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "for";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "endfor";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "generation";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "endgeneration";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "set";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "endset";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "comment";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "macro";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "endmacro";
    pcVar1 = "";
    break;
  case 0xf:
    pcVar2 = "filter";
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "endfilter";
    pcVar1 = "";
    break;
  case 0x11:
    pcVar2 = "break";
    pcVar1 = "";
    break;
  case 0x12:
    pcVar2 = "continue";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unknown";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string typeToString(Type t) {
        switch (t) {
            case Type::Text: return "text";
            case Type::Expression: return "expression";
            case Type::If: return "if";
            case Type::Else: return "else";
            case Type::Elif: return "elif";
            case Type::EndIf: return "endif";
            case Type::For: return "for";
            case Type::EndFor: return "endfor";
            case Type::Set: return "set";
            case Type::EndSet: return "endset";
            case Type::Comment: return "comment";
            case Type::Macro: return "macro";
            case Type::EndMacro: return "endmacro";
            case Type::Filter: return "filter";
            case Type::EndFilter: return "endfilter";
            case Type::Generation: return "generation";
            case Type::EndGeneration: return "endgeneration";
            case Type::Break: return "break";
            case Type::Continue: return "continue";
        }
        return "Unknown";
    }